

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

RegSlot __thiscall IRBuilder::GetEnvRegForInnerFrameDisplay(IRBuilder *this)

{
  RegSlot RVar1;
  JITTimeFunctionBody *this_00;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  RVar1 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this_00);
  if (RVar1 != 0xffffffff) {
    return RVar1;
  }
  RVar1 = GetEnvReg(this);
  return RVar1;
}

Assistant:

Js::RegSlot
IRBuilder::GetEnvRegForInnerFrameDisplay() const
{
    Js::RegSlot envReg = m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg();
    if (envReg == Js::Constants::NoRegister)
    {
        envReg = this->GetEnvReg();
    }

    return envReg;
}